

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.h
# Opt level: O0

SQInstance * SQInstance::Create(SQSharedState *ss,SQClass *theclass)

{
  long lVar1;
  SQUnsignedInteger SVar2;
  SQInstance *pSVar3;
  long in_RSI;
  SQInstance *newinst;
  SQInteger size;
  SQInteger in_stack_00000048;
  SQClass *in_stack_00000050;
  SQSharedState *in_stack_00000058;
  SQInstance *in_stack_00000060;
  long local_30;
  
  lVar1 = *(long *)(in_RSI + 0x1c0);
  SVar2 = sqvector<SQClassMember>::size((sqvector<SQClassMember> *)(in_RSI + 0x40));
  if (SVar2 == 0) {
    local_30 = 0;
  }
  else {
    SVar2 = sqvector<SQClassMember>::size((sqvector<SQClassMember> *)(in_RSI + 0x40));
    local_30 = SVar2 - 1;
  }
  pSVar3 = (SQInstance *)sq_vm_malloc(0x117601);
  SQInstance(in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000048);
  if (*(long *)(in_RSI + 0x1c0) != 0) {
    pSVar3->_userpointer =
         (SQUserPointer)
         ((long)pSVar3 + ((lVar1 + local_30 * 0x10 + 0x68) - *(long *)(in_RSI + 0x1c0)));
  }
  return pSVar3;
}

Assistant:

static SQInstance* Create(SQSharedState *ss,SQClass *theclass) {

        SQInteger size = calcinstancesize(theclass);
        SQInstance *newinst = (SQInstance *)SQ_MALLOC(size);
        new (newinst) SQInstance(ss, theclass,size);
        if(theclass->_udsize) {
            newinst->_userpointer = ((unsigned char *)newinst) + (size - theclass->_udsize);
        }
        return newinst;
    }